

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O2

void __thiscall sai::VirtualFileEntry::Seek(VirtualFileEntry *this,size_t NewOffset)

{
  size_t Index;
  ulong uVar1;
  bool bVar2;
  shared_ptr<sai::ifstream> Stream;
  __shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2> local_1030;
  VirtualPage local_1020;
  
  std::__shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1030,&this->FileStream);
  if ((local_1030._M_ptr != (element_type *)0x0) && (NewOffset < (this->FATData).Size)) {
    this->Offset = NewOffset;
    this->PageOffset = (ulong)((uint)NewOffset & 0xfff);
    Index = (size_t)(this->FATData).PageIndex;
    this->PageIndex = Index;
    uVar1 = NewOffset >> 0xc;
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      GetTablePage(&local_1020,this,Index);
      Index = (size_t)*(uint *)((long)&local_1020 + (ulong)((uint)this->PageIndex & 0x1ff) * 8 + 4);
      if (Index == 0) break;
      this->PageIndex = Index;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1030._M_refcount);
  return;
}

Assistant:

void VirtualFileEntry::Seek(std::size_t NewOffset)
{
	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		if( NewOffset >= FATData.Size )
		{
			// Invalid offset
			return;
		}
		Offset     = NewOffset;
		PageOffset = NewOffset % VirtualPage::PageSize;
		PageIndex  = FATData.PageIndex;
		for( std::size_t i = 0; i < NewOffset / VirtualPage::PageSize; ++i )
		{
			// Get the next page index in the page-chain
			const std::uint32_t NextPageIndex = GetTablePage(PageIndex)
													.PageEntries[PageIndex % VirtualPage::TableSpan]
													.NextPageIndex;
			if( NextPageIndex )
			{
				PageIndex = NextPageIndex;
			}
			else
			{
				break;
			}
		}
	}
}